

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::Session::runInternal(Session *this)

{
  unique_ptr<Catch::Config> *this_00;
  RunContext *this_01;
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  unique_ptr<Catch::IReporterFactory> *puVar3;
  IStreamingReporter *pIVar4;
  long lVar5;
  size_t sVar6;
  pointer pFVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  Config *pCVar11;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  IMutableContext *pIVar14;
  undefined4 extraout_var_00;
  long *plVar15;
  ListeningReporter *this_02;
  undefined4 extraout_var_01;
  IReporterFactory *pIVar16;
  undefined4 extraout_var_02;
  IStreamingReporter *pIVar17;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  _Base_ptr p_Var18;
  TestCaseInfo **testInfo;
  pointer pFVar19;
  long lVar20;
  unique_ptr<Catch::IReporterFactory> *this_03;
  TestCaseHandle *test;
  IStreamingReporterPtr reporter;
  Totals local_2e0;
  Totals totals;
  TestGroup tests;
  
  if (this->m_startupExceptions == false) {
    iVar9 = 0;
    if (((this->m_configData).showHelp == false) &&
       (iVar9 = 0, (this->m_configData).libIdentify == false)) {
      config(this);
      this_00 = &this->m_config;
      pCVar11 = Detail::unique_ptr<Catch::Config>::operator*(this_00);
      seedRng(&pCVar11->super_IConfig);
      if ((this->m_configData).filenamesAsTags == true) {
        pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar9 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
        puVar13 = (undefined8 *)
                  (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x10))
                            ((long *)CONCAT44(extraout_var,iVar9));
        puVar2 = (undefined8 *)puVar13[1];
        for (puVar13 = (undefined8 *)*puVar13; puVar13 != puVar2; puVar13 = puVar13 + 1) {
          TestCaseInfo::addFilenameTag((TestCaseInfo *)*puVar13);
        }
      }
      pIVar14 = getCurrentMutableContext();
      (*(pIVar14->super_IContext)._vptr_IContext[7])(pIVar14,this_00->m_ptr);
      pCVar11 = this_00->m_ptr;
      pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar9 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
      plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x20))
                                  ((long *)CONCAT44(extraout_var_00,iVar9));
      if (*plVar15 == plVar15[1]) {
        anon_unknown_23::createReporter
                  ((anon_unknown_23 *)&reporter,&(pCVar11->m_data).reporterName,
                   &pCVar11->super_IConfig);
      }
      else {
        reporter.m_ptr = (IStreamingReporter *)operator_new(0x30);
        ((reporter.m_ptr)->m_preferences).shouldRedirectStdOut = false;
        ((reporter.m_ptr)->m_preferences).shouldReportAllAssertions = true;
        (reporter.m_ptr)->_vptr_IStreamingReporter = (_func_int **)&PTR__ListeningReporter_001aaaa8;
        reporter.m_ptr[1]._vptr_IStreamingReporter = (_func_int **)0x0;
        *(undefined8 *)&reporter.m_ptr[1].m_preferences = 0;
        reporter.m_ptr[2]._vptr_IStreamingReporter = (_func_int **)0x0;
        *(undefined8 *)&reporter.m_ptr[2].m_preferences = 0;
        this_02 = (ListeningReporter *)
                  Detail::unique_ptr<Catch::IStreamingReporter>::operator*(&reporter);
        pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar9 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
        puVar13 = (undefined8 *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar9) + 0x20))
                            ((long *)CONCAT44(extraout_var_01,iVar9));
        puVar3 = (unique_ptr<Catch::IReporterFactory> *)puVar13[1];
        for (this_03 = (unique_ptr<Catch::IReporterFactory> *)*puVar13; this_03 != puVar3;
            this_03 = this_03 + 1) {
          pIVar16 = Detail::unique_ptr<Catch::IReporterFactory>::operator->(this_03);
          iVar9 = (*(pCVar11->super_IConfig)._vptr_IConfig[3])(pCVar11);
          tests.m_reporter = (IStreamingReporter *)CONCAT44(extraout_var_02,iVar9);
          tests.m_config = pCVar11;
          (*pIVar16->_vptr_IReporterFactory[2])
                    ((unique_ptr<Catch::IStreamingReporter> *)&local_2e0,pIVar16,&tests);
          std::
          vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>>
          ::emplace_back<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>
                    ((vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>>
                      *)&this_02->m_listeners,(unique_ptr<Catch::IStreamingReporter> *)&local_2e0);
          if ((IStreamingReporter *)local_2e0._0_8_ != (IStreamingReporter *)0x0) {
            (*(code *)((*(TestCaseInfo **)local_2e0._0_8_)->name)._M_string_length)();
          }
        }
        anon_unknown_23::createReporter
                  ((anon_unknown_23 *)&tests,&(pCVar11->m_data).reporterName,&pCVar11->super_IConfig
                  );
        ListeningReporter::addReporter(this_02,(IStreamingReporterPtr *)&tests);
        if (tests.m_reporter != (IStreamingReporter *)0x0) {
          (*(tests.m_reporter)->_vptr_IStreamingReporter[1])();
        }
      }
      pIVar17 = Detail::unique_ptr<Catch::IStreamingReporter>::operator*(&reporter);
      pCVar11 = Detail::unique_ptr<Catch::Config>::operator*(this_00);
      bVar8 = list(pIVar17,pCVar11);
      iVar9 = 0;
      if (!bVar8) {
        tests.m_config = this_00->m_ptr;
        this_01 = &tests.m_context;
        tests.m_reporter = reporter.m_ptr;
        RunContext::RunContext(this_01,&(tests.m_config)->super_IConfig,&reporter);
        p_Var1 = &tests.m_tests._M_t._M_impl.super__Rb_tree_header;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        testCases = getAllTestCasesSorted(&(tests.m_config)->super_IConfig);
        iVar9 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0xd])();
        TestSpec::matchesByFilter
                  ((Matches *)&local_2e0,(TestSpec *)CONCAT44(extraout_var_03,iVar9),testCases,
                   &(tests.m_config)->super_IConfig);
        std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
        _M_move_assign(&tests.m_matches,
                       (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                        *)&local_2e0);
        std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
        ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 *)&local_2e0);
        iVar9 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0xd])();
        pFVar7 = tests.m_matches.
                 super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pFVar19 = tests.m_matches.
                  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((tests.m_matches.
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             tests.m_matches.
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (*(long *)(CONCAT44(extraout_var_04,iVar9) + 0x18) ==
            *(long *)(CONCAT44(extraout_var_04,iVar9) + 0x20))) {
          pIVar4 = (IStreamingReporter *)
                   (testCases->
                   super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar17 = (IStreamingReporter *)
                         (testCases->
                         super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                         )._M_impl.super__Vector_impl_data._M_start; pIVar17 != pIVar4;
              pIVar17 = pIVar17 + 1) {
            if ((((TestCaseInfo *)pIVar17->_vptr_IStreamingReporter)->properties & IsHidden) == None
               ) {
              local_2e0._0_8_ = pIVar17;
              std::
              _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
              ::_M_emplace_unique<Catch::TestCaseHandle_const*>
                        ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                          *)&tests.m_tests,(TestCaseHandle **)&local_2e0);
            }
          }
        }
        else {
          for (; pFVar19 != pFVar7; pFVar19 = pFVar19 + 1) {
            std::
            _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
            ::
            _M_insert_range_unique<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*const*,std::vector<Catch::TestCaseHandle_const*,std::allocator<Catch::TestCaseHandle_const*>>>>
                      ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                        *)&tests.m_tests,
                       (__normal_iterator<const_Catch::TestCaseHandle_*const_*,_std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>_>
                        )(pFVar19->tests).
                         super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_Catch::TestCaseHandle_*const_*,_std::vector<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>_>
                        )(pFVar19->tests).
                         super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        iVar9 = (*((tests.m_config)->super_IConfig)._vptr_IConfig[0xd])();
        totals.error = 0;
        totals.assertions.passed = 0;
        totals.assertions.failed = 0;
        totals.assertions.failedButOk = 0;
        totals.testCases.passed = 0;
        totals.testCases.failed = 0;
        totals.testCases.failedButOk = 0;
        (*((tests.m_config)->super_IConfig)._vptr_IConfig[4])(&local_2e0);
        RunContext::testGroupStarting(this_01,(string *)&local_2e0,1,1);
        std::__cxx11::string::~string((string *)&local_2e0);
        for (p_Var18 = tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pFVar7 = tests.m_matches.
                     super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            sVar6 = tests.m_context.m_totals.assertions.failed,
            pFVar19 = tests.m_matches.
                      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            (_Rb_tree_header *)p_Var18 != p_Var1;
            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
          iVar10 = (*(tests.m_context.m_config)->_vptr_IConfig[9])();
          if (sVar6 < (ulong)(long)iVar10) {
            RunContext::runTest(&local_2e0,this_01,*(TestCaseHandle **)(p_Var18 + 1));
            Totals::operator+=(&totals,&local_2e0);
          }
          else {
            (*(tests.m_reporter)->_vptr_IStreamingReporter[0x12])
                      (tests.m_reporter,**(undefined8 **)(p_Var18 + 1));
          }
        }
        for (; pFVar19 != pFVar7; pFVar19 = pFVar19 + 1) {
          if ((pFVar19->tests).
              super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pFVar19->tests).
              super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            (*(tests.m_reporter)->_vptr_IStreamingReporter[2])(tests.m_reporter,pFVar19);
            totals.error = -1;
          }
        }
        lVar20 = *(long *)(CONCAT44(extraout_var_05,iVar9) + 0x18);
        lVar5 = *(long *)(CONCAT44(extraout_var_05,iVar9) + 0x20);
        if (lVar20 != lVar5) {
          for (; lVar20 != lVar5; lVar20 = lVar20 + 0x20) {
            (*(tests.m_reporter)->_vptr_IStreamingReporter[3])(tests.m_reporter,lVar20);
          }
        }
        (*((tests.m_config)->super_IConfig)._vptr_IConfig[4])(&local_2e0);
        RunContext::testGroupEnded(this_01,(string *)&local_2e0,&totals,1,1);
        std::__cxx11::string::~string((string *)&local_2e0);
        pCVar11 = Detail::unique_ptr<Catch::Config>::operator->(this_00);
        iVar9 = (*(pCVar11->super_IConfig)._vptr_IConfig[8])(pCVar11);
        if (((byte)iVar9 & totals.error == -1) == 0) {
          iVar9 = (int)totals.assertions.failed;
          if ((int)totals.assertions.failed < totals.error) {
            iVar9 = totals.error;
          }
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
        }
        else {
          iVar9 = 2;
        }
        anon_unknown_23::TestGroup::~TestGroup(&tests);
      }
      if (reporter.m_ptr != (IStreamingReporter *)0x0) {
        (*(reporter.m_ptr)->_vptr_IStreamingReporter[1])();
      }
    }
  }
  else {
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int Session::runInternal() {
        if (m_startupExceptions)
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY{
            config(); // Force config to be constructed

            seedRng(*m_config);

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = makeReporter(m_config.get());

            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { std::move(reporter), m_config.get() };
            auto const totals = tests.execute();

            if (m_config->warnAboutNoTests() && totals.error == -1)
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min)(MaxExitCode, (std::max)(totals.error, static_cast<int>(totals.assertions.failed)));
        }